

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PingId.cpp
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::Sys::Mfa::PingId::del
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,PingId *this,Path *path,Parameters *parameters)

{
  Client *client;
  Url local_48;
  Parameters *local_28;
  Parameters *parameters_local;
  Path *path_local;
  PingId *this_local;
  
  client = *(Client **)this;
  local_28 = parameters;
  parameters_local = (Parameters *)path;
  path_local = (Path *)this;
  this_local = (PingId *)__return_storage_ptr__;
  getUrl(&local_48,this,path);
  Mfa::del(__return_storage_ptr__,client,&local_48);
  Tiny<Vault::UrlDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string>
Vault::Sys::Mfa::PingId::del(const Path &path, const Parameters &parameters) {
  return Vault::Sys::Mfa::del(client_, getUrl(path));
}